

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

TestCaseGroup * vkt::sr::createBuiltinVarTests(TestContext *testCtx)

{
  undefined4 uVar1;
  char *__s;
  TestNode *pTVar2;
  TestNode *pTVar3;
  char *__end;
  long lVar4;
  uint uVar5;
  uint *local_a0;
  undefined8 local_98;
  uint local_90;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined8 uStack_88;
  TestNode *local_80;
  uint *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  TestContext *local_58;
  allocator<char> local_4a;
  allocator<char> local_49;
  TestNode *local_48;
  TestNode *local_40;
  _func_int **local_38;
  
  local_48 = (TestNode *)operator_new(0x70);
  local_58 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_48,testCtx,"builtin_var","Shader builtin variable tests.");
  local_80 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_80,local_58,"simple","Simple cases.");
  local_40 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_40,local_58,"input_variations","Input type variation tests.");
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,local_58,"frontfacing","Test gl_Frontfacing keyword.");
  pTVar3 = (TestNode *)operator_new(0x70);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"fragcoord_xyz","");
  local_78 = (uint *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"FragCoord xyz test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,(char *)local_a0,(char *)local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5a338;
  tcu::TestNode::addChild(local_80,pTVar3);
  if (local_78 != (uint *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90))) +
                             1);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"fragcoord_w","");
  local_78 = (uint *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"FragCoord w test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,(char *)local_a0,(char *)local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5a3f8;
  tcu::TestNode::addChild(local_80,pTVar3);
  if (local_78 != (uint *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90))) +
                             1);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"pointcoord","");
  local_78 = (uint *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"PointCoord test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,(char *)local_a0,(char *)local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5a4b8;
  tcu::TestNode::addChild(local_80,pTVar3);
  if (local_78 != (uint *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90))) +
                             1);
  }
  lVar4 = 0;
  local_38 = (_func_int **)&PTR__TestCase_00d4f460;
  do {
    pTVar3 = (TestNode *)operator_new(0x78);
    uVar1 = *(undefined4 *)((long)&createBuiltinVarTests::frontfacingCases[0].primitive + lVar4);
    __s = *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].desc + lVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].name + lVar4),&local_49)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_4a);
    tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,(char *)local_a0,(char *)local_78);
    pTVar3->_vptr_TestNode = local_38;
    if (local_78 != (uint *)&local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90)))
                               + 1);
    }
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5a578;
    *(undefined4 *)&pTVar3[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x78);
  tcu::TestNode::addChild(local_48,pTVar2);
  pTVar2 = local_80;
  uVar5 = 0;
  local_80 = (TestNode *)0x0;
  tcu::TestNode::addChild(local_48,pTVar2);
  do {
    pTVar2 = (TestNode *)operator_new(0x78);
    local_a0 = &local_90;
    uStack_8c = 0x74;
    local_90 = 0x75706e69;
    local_98 = 5;
    uStack_8b = 0;
    if (uVar5 == 0) {
      local_78 = (uint *)&local_68;
      local_68 = 0x6f6e5f7475706e69;
      local_70 = 10;
      uStack_60 = CONCAT53(uStack_60._3_5_,0x656e);
    }
    else {
      if ((uVar5 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      if ((uVar5 & 2) != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      if (3 < uVar5) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      local_78 = (uint *)&local_68;
      if (local_a0 == &local_90) {
        uStack_60 = uStack_88;
      }
      else {
        local_78 = local_a0;
      }
      local_68 = CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90)));
      local_70 = local_98;
      local_98 = 0;
      local_90 = local_90 & 0xffffff00;
    }
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Input variation test","");
    tcu::TestCase::TestCase((TestCase *)pTVar2,local_58,(char *)local_78,(char *)local_a0);
    pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d5a698;
    *(short *)&pTVar2[1]._vptr_TestNode = (short)uVar5;
    tcu::TestNode::addChild(local_40,pTVar2);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT26(uStack_8a,CONCAT15(uStack_8b,CONCAT14(uStack_8c,local_90)))
                               + 1);
    }
    if (local_78 != (uint *)&local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    pTVar2 = local_40;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  local_40 = (TestNode *)0x0;
  local_80 = (TestNode *)0x0;
  tcu::TestNode::addChild(local_48,pTVar2);
  return (TestCaseGroup *)local_48;
}

Assistant:

TestCaseGroup* createBuiltinVarTests (TestContext& testCtx)
{
	de::MovePtr<TestCaseGroup> builtinGroup			(new TestCaseGroup(testCtx, "builtin_var", "Shader builtin variable tests."));
	de::MovePtr<TestCaseGroup> simpleGroup			(new TestCaseGroup(testCtx, "simple", "Simple cases."));
	de::MovePtr<TestCaseGroup> inputVariationsGroup	(new TestCaseGroup(testCtx, "input_variations", "Input type variation tests."));
	de::MovePtr<TestCaseGroup> frontFacingGroup		(new TestCaseGroup(testCtx, "frontfacing", "Test gl_Frontfacing keyword."));

	simpleGroup->addChild(new BuiltinGlFragCoordXYZCase(testCtx, "fragcoord_xyz", "FragCoord xyz test"));
	simpleGroup->addChild(new BuiltinGlFragCoordWCase(testCtx, "fragcoord_w", "FragCoord w test"));
	simpleGroup->addChild(new BuiltinGlPointCoordCase(testCtx, "pointcoord", "PointCoord test"));

	// gl_FrontFacing tests
	{
		static const struct PrimitiveTable
		{
			const char*				name;
			const char*				desc;
			VkPrimitiveTopology		primitive;
		} frontfacingCases[] =
		{
			{ "point_list",		"Test that points are frontfacing",							VK_PRIMITIVE_TOPOLOGY_POINT_LIST },
			{ "line_list",		"Test that lines are frontfacing",							VK_PRIMITIVE_TOPOLOGY_LINE_LIST },
			{ "triangle_list",	"Test that triangles can be frontfacing or backfacing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST },
			{ "triangle_strip",	"Test that traiangle strips can be front or back facing",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP },
			{ "triangle_fan",	"Test that triangle fans can be front or back facing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN },
		};

		for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(frontfacingCases); ndx++)
			frontFacingGroup->addChild(new BuiltinGlFrontFacingCase(testCtx, frontfacingCases[ndx].primitive, frontfacingCases[ndx].name, frontfacingCases[ndx].desc));
	}

	builtinGroup->addChild(frontFacingGroup.release());
	builtinGroup->addChild(simpleGroup.release());

	for (deUint16 shaderType = 0; shaderType <= (SHADER_INPUT_BUILTIN_BIT | SHADER_INPUT_VARYING_BIT | SHADER_INPUT_CONSTANT_BIT); ++shaderType)
	{
		inputVariationsGroup->addChild(new BuiltinInputVariationsCase(testCtx, shaderInputTypeToString(shaderType), "Input variation test", shaderType));
	}

	builtinGroup->addChild(inputVariationsGroup.release());
	return builtinGroup.release();
}